

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O1

nng_err http_scan_line(void *vbuf,size_t n,size_t *lenp)

{
  byte bVar1;
  nng_err nVar2;
  size_t sVar3;
  byte bVar4;
  nng_err in_R10D;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  nVar2 = NNG_EAGAIN;
  if (n != 0) {
    bVar4 = 0;
    sVar3 = 1;
    do {
      bVar1 = *(byte *)((long)vbuf + (sVar3 - 1));
      if (bVar1 == 10) {
        *(undefined1 *)((long)vbuf + sVar3 + (-1 - (ulong)(bVar4 == 0xd))) = 0;
        *lenp = sVar3;
        in_R10D = NNG_OK;
        bVar8 = false;
      }
      else {
        bVar5 = 0x1f < bVar1;
        bVar6 = bVar1 == 0xd;
        bVar7 = bVar4 != 0xd;
        bVar8 = bVar7 && (bVar6 || bVar5);
        if (bVar7 && (bVar6 || bVar5)) {
          bVar4 = bVar1;
        }
        if (!bVar7 || !bVar6 && !bVar5) {
          in_R10D = NNG_EPROTO;
        }
      }
      nVar2 = in_R10D;
    } while ((bVar8) && (bVar8 = sVar3 != n, sVar3 = sVar3 + 1, nVar2 = NNG_EAGAIN, bVar8));
  }
  return nVar2;
}

Assistant:

static nng_err
http_scan_line(void *vbuf, size_t n, size_t *lenp)
{
	size_t   len;
	char     lc;
	uint8_t *buf = vbuf;

	lc = 0;
	for (len = 0; len < n; len++) {
		uint8_t c = buf[len];
		if (c == '\n') {
			// Technically we should be receiving CRLF, but
			// debugging is easier with just LF, so we behave
			// following Postel's Law.
			if (lc != '\r') {
				buf[len] = '\0';
			} else {
				buf[len - 1] = '\0';
			}
			*lenp = len + 1;
			return (0);
		}
		// If we have a control character (other than CR), or a CR
		// followed by anything other than LF, then its an error.
		if (((c < ' ') && (c != '\r')) || (lc == '\r')) {
			return (NNG_EPROTO);
		}
		lc = c;
	}
	// Scanned the entire content, but did not find a line.
	return (NNG_EAGAIN);
}